

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilNam.c
# Opt level: O0

int Abc_NamStrHash(char *pStr,char *pLim,int nTableSize)

{
  uint local_24;
  uint local_20;
  uint uHash;
  uint i;
  int nTableSize_local;
  char *pLim_local;
  char *pStr_local;
  
  if (pLim == (char *)0x0) {
    local_24 = 0;
    for (local_20 = 0; pStr[local_20] != '\0'; local_20 = local_20 + 1) {
      if ((local_20 & 1) == 0) {
        local_24 = (int)pStr[local_20] * Abc_NamStrHash::s_FPrimes[local_20 & 0x7f] ^ local_24;
      }
      else {
        local_24 = (int)pStr[local_20] * Abc_NamStrHash::s_FPrimes[local_20 & 0x7f] * local_24;
      }
    }
  }
  else {
    local_24 = 0;
    for (local_20 = 0; pStr + local_20 < pLim; local_20 = local_20 + 1) {
      if ((local_20 & 1) == 0) {
        local_24 = (int)pStr[local_20] * Abc_NamStrHash::s_FPrimes[local_20 & 0x7f] ^ local_24;
      }
      else {
        local_24 = (int)pStr[local_20] * Abc_NamStrHash::s_FPrimes[local_20 & 0x7f] * local_24;
      }
    }
  }
  return local_24 % (uint)nTableSize;
}

Assistant:

int Abc_NamStrHash( const char * pStr, const char * pLim, int nTableSize )
{
    static int s_FPrimes[128] = { 
        1009, 1049, 1093, 1151, 1201, 1249, 1297, 1361, 1427, 1459, 
        1499, 1559, 1607, 1657, 1709, 1759, 1823, 1877, 1933, 1997, 
        2039, 2089, 2141, 2213, 2269, 2311, 2371, 2411, 2467, 2543, 
        2609, 2663, 2699, 2741, 2797, 2851, 2909, 2969, 3037, 3089, 
        3169, 3221, 3299, 3331, 3389, 3461, 3517, 3557, 3613, 3671, 
        3719, 3779, 3847, 3907, 3943, 4013, 4073, 4129, 4201, 4243, 
        4289, 4363, 4441, 4493, 4549, 4621, 4663, 4729, 4793, 4871, 
        4933, 4973, 5021, 5087, 5153, 5227, 5281, 5351, 5417, 5471, 
        5519, 5573, 5651, 5693, 5749, 5821, 5861, 5923, 6011, 6073, 
        6131, 6199, 6257, 6301, 6353, 6397, 6481, 6563, 6619, 6689, 
        6737, 6803, 6863, 6917, 6977, 7027, 7109, 7187, 7237, 7309, 
        7393, 7477, 7523, 7561, 7607, 7681, 7727, 7817, 7877, 7933, 
        8011, 8039, 8059, 8081, 8093, 8111, 8123, 8147
    };
    unsigned i, uHash;
    if ( pLim )
    {
        for ( uHash = 0, i = 0; pStr+i < pLim; i++ )
            if ( i & 1 ) 
                uHash *= pStr[i] * s_FPrimes[i & 0x7F];
            else
                uHash ^= pStr[i] * s_FPrimes[i & 0x7F];
    }
    else
    {
        for ( uHash = 0, i = 0; pStr[i]; i++ )
            if ( i & 1 ) 
                uHash *= pStr[i] * s_FPrimes[i & 0x7F];
            else
                uHash ^= pStr[i] * s_FPrimes[i & 0x7F];
    }
    return uHash % nTableSize;
}